

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O2

void __thiscall
ncnn::Mat::to_pixels_resize(Mat *this,uchar *pixels,int type,int target_width,int target_height)

{
  int iVar1;
  int target_stride;
  
  iVar1 = type >> 0x10;
  if ((uint)type < 0x10000) {
    iVar1 = type;
  }
  if (iVar1 - 1U < 2) {
    target_stride = target_width * 3;
  }
  else {
    target_stride = target_width;
    if (iVar1 != 3) {
      if (iVar1 == 4) {
        to_pixels_resize(this,pixels,type,target_width,target_height,target_width * 4);
        return;
      }
      return;
    }
  }
  to_pixels_resize(this,pixels,type,target_width,target_height,target_stride);
  return;
}

Assistant:

void Mat::to_pixels_resize(unsigned char* pixels, int type, int target_width, int target_height) const
{
    int type_to = (type & PIXEL_CONVERT_MASK) ? (type >> PIXEL_CONVERT_SHIFT) : (type & PIXEL_FORMAT_MASK);

    if (type_to == PIXEL_RGB || type_to == PIXEL_BGR)
    {
        to_pixels_resize(pixels, type, target_width, target_height, target_width * 3);
    }
    else if (type_to == PIXEL_GRAY)
    {
        to_pixels_resize(pixels, type, target_width, target_height, target_width * 1);
    }
    else if (type_to == PIXEL_RGBA)
    {
        to_pixels_resize(pixels, type, target_width, target_height, target_width * 4);
    }
}